

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

int dwarf_bitoffset(Dwarf_Die die,Dwarf_Half *attribute,Dwarf_Unsigned *ret_offset,
                   Dwarf_Error *error)

{
  int local_3c;
  Dwarf_Error pDStack_38;
  int res;
  Dwarf_Unsigned luns;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *ret_offset_local;
  Dwarf_Half *attribute_local;
  Dwarf_Die die_local;
  
  pDStack_38 = (Dwarf_Error)0x0;
  luns = (Dwarf_Unsigned)error;
  error_local = (Dwarf_Error *)ret_offset;
  ret_offset_local = (Dwarf_Unsigned *)attribute;
  attribute_local = (Dwarf_Half *)die;
  local_3c = _dwarf_die_attr_unsigned_constant
                       (die,0x6b,(Dwarf_Unsigned *)&stack0xffffffffffffffc8,error);
  if (local_3c == -1) {
    local_3c = _dwarf_die_attr_unsigned_constant
                         ((Dwarf_Die)attribute_local,0xc,(Dwarf_Unsigned *)&stack0xffffffffffffffc8,
                          (Dwarf_Error *)luns);
    if (local_3c == 0) {
      *(undefined2 *)ret_offset_local = 0xc;
      *error_local = pDStack_38;
      return 0;
    }
  }
  else if (local_3c == 0) {
    *(undefined2 *)ret_offset_local = 0x6b;
    *error_local = pDStack_38;
    return 0;
  }
  return local_3c;
}

Assistant:

int
dwarf_bitoffset(Dwarf_Die die,
    Dwarf_Half     *attribute,
    Dwarf_Unsigned *ret_offset,
    Dwarf_Error    *error)
{
    Dwarf_Unsigned luns = 0;
    int res = 0;
    /* DWARF4,5 case */
    res = _dwarf_die_attr_unsigned_constant(die,
        DW_AT_data_bit_offset, &luns, error);
    if (res == DW_DLV_NO_ENTRY) {
        /* DWARF2, DWARF3 case. */
        res = _dwarf_die_attr_unsigned_constant(die,
            DW_AT_bit_offset, &luns, error);
        if (res == DW_DLV_OK) {
            *attribute = DW_AT_bit_offset;
            *ret_offset = luns;
            return DW_DLV_OK;
        }
    } else if (res == DW_DLV_OK) {
        *attribute = DW_AT_data_bit_offset;
        *ret_offset = luns;
        return DW_DLV_OK;
    } else { /* fall to return */ }
    return res;
}